

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O3

IntVar * getConstant(int v)

{
  _Base_ptr p_Var1;
  IntVar *pIVar2;
  mapped_type *this;
  _Base_ptr p_Var3;
  int in_EDI;
  IntVar *var;
  stringstream ss;
  IntVar *local_1c8;
  int local_1bc;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  if (ic_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &ic_map._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = ic_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (in_EDI <= (int)p_Var3[1]._M_color) {
        p_Var1 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < in_EDI];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != &ic_map._M_t._M_impl.super__Rb_tree_header) &&
       ((int)p_Var1[1]._M_color <= in_EDI)) {
      return (IntVar *)p_Var1[1]._M_parent;
    }
  }
  pIVar2 = (IntVar *)malloc(0xb0);
  IntVar::IntVar(pIVar2,in_EDI,in_EDI);
  local_1c8 = pIVar2;
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"constant_",9);
  std::ostream::operator<<((ostream *)local_188,in_EDI);
  std::__cxx11::stringbuf::str();
  this = std::
         map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](&intVarString_abi_cxx11_,&local_1c8);
  std::__cxx11::string::operator=((string *)this,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  IntVar::specialiseToEL(local_1c8);
  std::
  _Rb_tree<int,std::pair<int_const,IntVar*>,std::_Select1st<std::pair<int_const,IntVar*>>,std::less<int>,std::allocator<std::pair<int_const,IntVar*>>>
  ::_M_emplace_unique<int&,IntVar*&>
            ((_Rb_tree<int,std::pair<int_const,IntVar*>,std::_Select1st<std::pair<int_const,IntVar*>>,std::less<int>,std::allocator<std::pair<int_const,IntVar*>>>
              *)&ic_map,&local_1bc,&local_1c8);
  pIVar2 = local_1c8;
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return pIVar2;
}

Assistant:

IntVar* getConstant(int v) {
	auto it = ic_map.find(v);
	if (it != ic_map.end()) {
		return it->second;
	}
	IntVar* var = newIntVar(v, v);

	std::stringstream ss;
	ss << "constant_" << v;
	intVarString[var] = ss.str();

	var->specialiseToEL();
	ic_map.emplace(v, var);

	return var;
}